

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_tree.cpp
# Opt level: O1

uchar __thiscall node_t::first_byte_at(node_t *this,size_t index_)

{
  if (*(uint *)(this->_data + 8) <= index_) {
    first_byte_at();
  }
  return this->_data[index_ + 0xc + (ulong)*(uint *)(this->_data + 4)];
}

Assistant:

unsigned char node_t::first_byte_at (size_t index_)
{
    zmq_assert (index_ < edgecount ());
    return first_bytes ()[index_];
}